

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddDecomp.c
# Opt level: O3

double CountMinterms(DdNode *node,double max,st__table *mintermTable,FILE *fp)

{
  ulong uVar1;
  int iVar2;
  int *piVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double *dummy;
  double *local_40;
  double local_38;
  
  piVar3 = (int *)((ulong)node & 0xfffffffffffffffe);
  if (*piVar3 == 0x7fffffff) {
    dVar5 = 0.0;
    if (zero != node) {
      dVar5 = max;
    }
  }
  else {
    iVar2 = st__lookup(mintermTable,(char *)node,(char **)&local_40);
    if (iVar2 == 0) {
      uVar1 = *(ulong *)(piVar3 + 6);
      uVar4 = (ulong)((uint)node & 1);
      local_38 = CountMinterms((DdNode *)(*(ulong *)(piVar3 + 4) ^ uVar4),max,mintermTable,fp);
      dVar5 = -1.0;
      if ((local_38 != -1.0) || (NAN(local_38))) {
        dVar6 = CountMinterms((DdNode *)(uVar4 ^ uVar1),max,mintermTable,fp);
        dVar5 = -1.0;
        if ((dVar6 != -1.0) || (NAN(dVar6))) {
          local_40 = (double *)malloc(8);
          dVar5 = -1.0;
          if (local_40 != (double *)0x0) {
            dVar5 = dVar6 * 0.5 + local_38 * 0.5;
            *local_40 = dVar5;
            iVar2 = st__insert(mintermTable,(char *)node,(char *)local_40);
            if (iVar2 == -10000) {
              fwrite("st table insert failed\n",0x17,1,(FILE *)fp);
            }
          }
        }
      }
    }
    else {
      dVar5 = *local_40;
    }
  }
  return dVar5;
}

Assistant:

static double
CountMinterms(
  DdNode * node,
  double  max,
  st__table * mintermTable,
  FILE *fp)
{
    DdNode *N, *Nv, *Nnv;
    double min, minNv, minNnv;
    double *dummy;

    N = Cudd_Regular(node);

    if (cuddIsConstant(N)) {
        if (node == zero) {
            return(0);
        } else {
            return(max);
        }
    }

    /* Return the entry in the table if found. */
    if ( st__lookup(mintermTable, (const char *)node, (char **)&dummy)) {
        min = *dummy;
        return(min);
    }

    Nv = cuddT(N);
    Nnv = cuddE(N);
    Nv = Cudd_NotCond(Nv, Cudd_IsComplement(node));
    Nnv = Cudd_NotCond(Nnv, Cudd_IsComplement(node));

    /* Recur on the children. */
    minNv = CountMinterms(Nv, max, mintermTable, fp);
    if (minNv == -1.0) return(-1.0);
    minNnv = CountMinterms(Nnv, max, mintermTable, fp);
    if (minNnv == -1.0) return(-1.0);
    min = minNv / 2.0 + minNnv / 2.0;
    /* store 
     */

    dummy = ABC_ALLOC(double, 1);
    if (dummy == NULL) return(-1.0);
    *dummy = min;
    if ( st__insert(mintermTable, (char *)node, (char *)dummy) == st__OUT_OF_MEM) {
        (void) fprintf(fp, "st table insert failed\n");
    }
    return(min);

}